

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

double SoapySDRDevice_getGainElement(SoapySDRDevice *device,int direction,size_t channel,char *name)

{
  undefined1 *puVar1;
  allocator local_49;
  double local_48;
  string local_40 [32];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014be88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string(local_40,name,&local_49);
  local_48 = (double)(**(code **)(*(long *)device + 0x1a0))(device,direction,channel,local_40);
  std::__cxx11::string::~string(local_40);
  return local_48;
}

Assistant:

double SoapySDRDevice_getGainElement(const SoapySDRDevice *device, const int direction, const size_t channel, const char *name)
{
    __SOAPY_SDR_C_TRY
    return device->getGain(direction, channel, name);
    __SOAPY_SDR_C_CATCH_RET(NAN);
}